

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O1

void __thiscall duckdb::LocalSortState::LocalSortState(LocalSortState *this)

{
  SelectionVector *pSVar1;
  pointer *__ptr_4;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer *__ptr_1;
  LogicalType local_40;
  
  this->initialized = false;
  (this->radix_sorting_data).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->blob_sorting_data).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->blob_sorting_heap).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->payload_data).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->payload_heap).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->sorted_blocks).
  super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sorted_blocks).
  super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sorted_blocks).
  super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = FlatVector::IncrementalSelectionVector();
  this->sel_ptr = pSVar1;
  LogicalType::LogicalType(&local_40,POINTER);
  Vector::Vector(&this->addresses,&local_40,0x800);
  LogicalType::~LogicalType(&local_40);
  return;
}

Assistant:

LocalSortState::LocalSortState() : initialized(false) {
	if (!Radix::IsLittleEndian()) {
		throw NotImplementedException("Sorting is not supported on big endian architectures");
	}
}